

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O0

Ptr __thiscall core::image::expand_grayscale<unsigned_char>(image *this,ConstPtr *image)

{
  uchar uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int height;
  ImageBase *pIVar5;
  invalid_argument *piVar6;
  TypedImageBase<unsigned_char> *pTVar7;
  element_type *peVar8;
  uchar *puVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  Ptr PVar12;
  int local_34;
  int i;
  int pixels;
  bool has_alpha;
  int ic;
  ConstPtr *image_local;
  Ptr *out;
  
  bVar2 = std::operator==(image,(nullptr_t)0x0);
  if (bVar2) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Null image given");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar3 = ImageBase::channels(pIVar5);
  if ((iVar3 != 1) && (iVar3 != 2)) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Image must be in G or GA");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  Image<unsigned_char>::create();
  pTVar7 = &std::
            __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this)->super_TypedImageBase<unsigned_char>;
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  iVar4 = ImageBase::width(pIVar5);
  pIVar5 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)image);
  height = ImageBase::height(pIVar5);
  TypedImageBase<unsigned_char>::allocate(pTVar7,iVar4,height,(iVar3 == 2) + 3);
  pTVar7 = &std::
            __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)image)->super_TypedImageBase<unsigned_char>;
  iVar4 = TypedImageBase<unsigned_char>::get_pixel_amount(pTVar7);
  _Var11._M_pi = extraout_RDX;
  for (local_34 = 0; local_34 < iVar4; local_34 = local_34 + 1) {
    peVar8 = std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    puVar9 = Image<unsigned_char>::at(peVar8,local_34,0);
    uVar1 = *puVar9;
    peVar10 = std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    puVar9 = Image<unsigned_char>::at(peVar10,local_34,0);
    *puVar9 = uVar1;
    peVar8 = std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    puVar9 = Image<unsigned_char>::at(peVar8,local_34,0);
    uVar1 = *puVar9;
    peVar10 = std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    puVar9 = Image<unsigned_char>::at(peVar10,local_34,1);
    *puVar9 = uVar1;
    peVar8 = std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)image);
    puVar9 = Image<unsigned_char>::at(peVar8,local_34,0);
    uVar1 = *puVar9;
    peVar10 = std::
              __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    puVar9 = Image<unsigned_char>::at(peVar10,local_34,2);
    *puVar9 = uVar1;
    _Var11._M_pi = extraout_RDX_00;
    if (iVar3 == 2) {
      peVar8 = std::
               __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)image);
      puVar9 = Image<unsigned_char>::at(peVar8,local_34,1);
      uVar1 = *puVar9;
      peVar10 = std::
                __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      puVar9 = Image<unsigned_char>::at(peVar10,local_34,3);
      *puVar9 = uVar1;
      _Var11._M_pi = extraout_RDX_01;
    }
  }
  PVar12.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var11._M_pi;
  PVar12.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar12.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename Image<T>::Ptr
expand_grayscale (typename Image<T>::ConstPtr image)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    int const ic = image->channels();
    if (ic != 1 && ic != 2)
        throw std::invalid_argument("Image must be in G or GA");

    bool const has_alpha = (ic == 2);

    typename Image<T>::Ptr out(Image<T>::create());
    out->allocate(image->width(), image->height(), 3 + has_alpha);

    int pixels = image->get_pixel_amount();
    for (int i = 0; i < pixels; ++i)
    {
        out->at(i, 0) = image->at(i, 0);
        out->at(i, 1) = image->at(i, 0);
        out->at(i, 2) = image->at(i, 0);
        if (has_alpha)
            out->at(i, 3) = image->at(i, 1);
    }

    return out;
}